

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O0

TPM_RC Initialize_TPM_Codec(TSS_DEVICE *tpm)

{
  TPM_COMM_TYPE TVar1;
  LOGGER_LOG p_Var2;
  TPM_COMM_HANDLE pTVar3;
  char *pcVar4;
  LOGGER_LOG l_2;
  TPM_COMM_TYPE comm_type;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  TPM_RC result;
  TSS_DEVICE *tpm_local;
  
  if (tpm == (TSS_DEVICE *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                ,"Initialize_TPM_Codec",0xfb,1,"Invalid parameter tpm is NULL");
    }
    l._4_4_ = 0x101;
  }
  else {
    pTVar3 = tpm_comm_create(tpm->comms_endpoint);
    tpm->tpm_comm_handle = pTVar3;
    if (pTVar3 == (TPM_COMM_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                  ,"Initialize_TPM_Codec",0x100,1,"creating tpm_comm object");
      }
      l._4_4_ = 0x101;
    }
    else {
      TVar1 = tpm_comm_get_type(tpm->tpm_comm_handle);
      if (TVar1 == TPM_COMM_TYPE_EMULATOR) {
        l._4_4_ = TPM2_Startup(tpm,0);
        if ((l._4_4_ == 0) || (l._4_4_ == 0x100)) {
          l._4_4_ = 0;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar4 = TSS_StatusValueName(l._4_4_);
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                      ,"Initialize_TPM_Codec",0x10b,1,"calling TPM2_Startup %s",pcVar4);
          }
          tpm_comm_destroy(tpm->tpm_comm_handle);
        }
      }
      else {
        l._4_4_ = 0;
      }
      TPM2_FlushContext(tpm,0x3000000);
      TPM2_FlushContext(tpm,0x3000001);
      TPM2_FlushContext(tpm,0x3000002);
    }
  }
  return l._4_4_;
}

Assistant:

TPM_RC Initialize_TPM_Codec(TSS_DEVICE* tpm)
{
    TPM_RC result;
    if (tpm == NULL)
    {
        LogError("Invalid parameter tpm is NULL");
        result = TPM_RC_FAILURE;
    }
    else if ( (tpm->tpm_comm_handle = tpm_comm_create(tpm->comms_endpoint)) == NULL)
    {
        LogError("creating tpm_comm object");
        result = TPM_RC_FAILURE;
    }
    else
    {
        TPM_COMM_TYPE comm_type = tpm_comm_get_type(tpm->tpm_comm_handle);
        if (comm_type == TPM_COMM_TYPE_EMULATOR)
        {
            result = TPM2_Startup(tpm, TPM_SU_CLEAR);
            if (result != TPM_RC_SUCCESS && result != TPM_RC_INITIALIZE)
            {
                LogError("calling TPM2_Startup %s", TSS_StatusValueName(result) );
                tpm_comm_destroy(tpm->tpm_comm_handle);
            }
            else
            {
                result = TPM_RC_SUCCESS;
            }
        }
        else
        {
            result = TPM_RC_SUCCESS;
        }
        // Clear out from previous runs
        (void)TPM2_FlushContext(tpm, HR_POLICY_SESSION);
        (void)TPM2_FlushContext(tpm, HR_POLICY_SESSION | 1);
        (void)TPM2_FlushContext(tpm, HR_POLICY_SESSION | 2);
    }
    return result;
}